

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

MQTTErrors mqtt_unsubscribe(mqtt_client *client,char *topic_name)

{
  mqtt_pal_mutex_t *__mutex;
  mqtt_queued_message *pmVar1;
  uint8_t *puVar2;
  uint uVar3;
  mqtt_queued_message *pmVar4;
  size_t sVar5;
  mqtt_queued_message *pmVar6;
  uint uVar7;
  size_t sVar8;
  MQTTErrors MVar9;
  uint16_t uVar10;
  uint uVar11;
  
  uVar3._0_2_ = client->pid_lfsr;
  uVar3._2_2_ = client->keep_alive;
  uVar11 = 0xa3;
  if ((undefined2)uVar3 != 0) {
    uVar11 = uVar3;
  }
  pmVar1 = (mqtt_queued_message *)(client->mq).mem_end;
  do {
    uVar7 = (uVar11 & 0xffff) >> 1;
    uVar3 = uVar11 & 1;
    pmVar6 = pmVar1;
    uVar11 = uVar7 ^ 0xffffb400;
    if (uVar3 == 0) {
      uVar11 = uVar7;
    }
    do {
      uVar10 = (uint16_t)uVar11;
      if (pmVar6 + -1 < (client->mq).queue_tail) {
        client->pid_lfsr = uVar10;
        __mutex = &client->mutex;
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (client->error < 0) {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          return client->error;
        }
        sVar5 = mqtt_pack_unsubscribe_request
                          ((client->mq).curr,(client->mq).curr_sz,uVar11 & 0xffff,topic_name,0);
        if ((long)sVar5 < 0) {
LAB_001032d3:
          MVar9 = (MQTTErrors)sVar5;
          client->error = MVar9;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        else {
          if (sVar5 == 0) {
            mqtt_mq_clean(&client->mq);
            sVar5 = mqtt_pack_unsubscribe_request
                              ((client->mq).curr,(client->mq).curr_sz,uVar11 & 0xffff,topic_name,0);
            if ((long)sVar5 < 0) goto LAB_001032d3;
            if (sVar5 == 0) {
              client->error = MQTT_ERROR_SEND_BUFFER_IS_FULL;
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              return MQTT_ERROR_SEND_BUFFER_IS_FULL;
            }
          }
          puVar2 = (client->mq).curr;
          pmVar1 = (client->mq).queue_tail;
          (client->mq).queue_tail = pmVar1 + -1;
          pmVar1[-1].start = puVar2;
          pmVar1[-1].size = sVar5;
          pmVar1[-1].state = MQTT_QUEUED_UNSENT;
          pmVar6 = (mqtt_queued_message *)(puVar2 + sVar5);
          sVar8 = (long)(pmVar1 + -2) - (long)pmVar6;
          sVar5 = 0;
          if (pmVar6 <= pmVar1 + -2 && sVar8 != 0) {
            sVar5 = sVar8;
          }
          (client->mq).curr = (uint8_t *)pmVar6;
          (client->mq).curr_sz = sVar5;
          pmVar1[-1].control_type = MQTT_CONTROL_UNSUBSCRIBE;
          pmVar1[-1].packet_id = uVar10;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          MVar9 = MQTT_OK;
        }
        return MVar9;
      }
      pmVar4 = pmVar6 + -1;
      pmVar6 = pmVar6 + -1;
    } while (pmVar4->packet_id != uVar10);
  } while( true );
}

Assistant:

enum MQTTErrors mqtt_unsubscribe(struct mqtt_client *client,
                         const char* topic_name)
{
    uint16_t packet_id = __mqtt_next_pid(client);
    ssize_t rv;
    struct mqtt_queued_message *msg;
    MQTT_PAL_MUTEX_LOCK(&client->mutex);

    /* try to pack the message */
    MQTT_CLIENT_TRY_PACK(
        rv, msg, client, 
        mqtt_pack_unsubscribe_request(
            client->mq.curr, client->mq.curr_sz,
            packet_id,
            topic_name,
            (const char*)NULL
        ), 
        1
    );
    /* save the control type and packet id of the message */
    msg->control_type = MQTT_CONTROL_UNSUBSCRIBE;
    msg->packet_id = packet_id;

    MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
    return MQTT_OK;
}